

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::removeFromMaps(Connection *this)

{
  NATHolePuncher *pNVar1;
  uint64_t uVar2;
  P2PConnectionKeyMap *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  OutputWorker *pOVar7;
  ushort uVar8;
  UDPAddress addr;
  address local_1f0;
  string local_1d0;
  Locker locker;
  ostringstream local_1a0 [376];
  
  if (this->RemovedFromMaps == false) {
    this->RemovedFromMaps = true;
    bVar6 = ConnectionIdMap::RemoveAndUnassignId
                      ((this->Deps).IdMap,this->LocallyAssignedIdForRemoteHost,
                       &this->super_IConnection);
    if ((!bVar6) && ((int)(this->Logger).ChannelMinLevel < 4)) {
      locker.TheLock = (Lock *)(this->Logger).ChannelName;
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::operator<<((ostream *)local_1a0,(string *)&(this->Logger).Prefix);
      std::operator<<((ostream *)local_1a0,"Unable to remove/unassign id=");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      pOVar7 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)&locker);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
    }
    locker.TheLock = &(this->Outgoing).PrivateLock;
    std::recursive_mutex::lock(&(locker.TheLock)->cs);
    addr.impl_.data_._0_8_ = *(undefined8 *)&(this->Outgoing).PeerUDPAddress.impl_.data_;
    uVar4 = *(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 8);
    uVar5 = *(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 0x14);
    addr.impl_.data_._16_4_ =
         (undefined4)
         ((ulong)*(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 0xc) >> 0x20);
    addr.impl_.data_._20_4_ = (undefined4)uVar5;
    addr.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar5 >> 0x20);
    addr.impl_.data_._8_4_ = (undefined4)uVar4;
    addr.impl_.data_._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    Locker::~Locker(&locker);
    bVar6 = ConnectionAddrMap::RemoveAddress((this->Deps).AddressMap,&addr,&this->super_IConnection)
    ;
    if (!bVar6) {
      if (addr.impl_.data_.base.sa_family != 2) {
        local_1f0.ipv6_address_.addr_.__in6_u._0_8_ =
             CONCAT44(addr.impl_.data_._12_4_,addr.impl_.data_._8_4_);
        local_1f0.ipv6_address_.addr_.__in6_u._8_8_ =
             CONCAT44(addr.impl_.data_._20_4_,addr.impl_.data_._16_4_);
        local_1f0.ipv6_address_.scope_id_ = (unsigned_long)addr.impl_.data_.v6.sin6_scope_id;
        local_1f0.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_1f0.ipv6_address_.scope_id_ = 0;
        local_1f0.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_1f0.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_1f0.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(in4_addr_type)addr.impl_.data_.v6.sin6_flowinfo;
      }
      local_1f0.type_ = (anon_enum_32)(addr.impl_.data_.base.sa_family != 2);
      asio::ip::address::to_string_abi_cxx11_(&local_1d0,&local_1f0);
      if ((int)(this->Logger).ChannelMinLevel < 4) {
        locker.TheLock = (Lock *)(this->Logger).ChannelName;
        uVar8 = swap_bytes(addr.impl_.data_.v4.sin_port);
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::operator<<((ostream *)local_1a0,(string *)&(this->Logger).Prefix);
        std::operator<<((ostream *)local_1a0,"Unable to remove/unassign address ");
        std::operator<<((ostream *)local_1a0,(string *)&local_1d0);
        std::operator<<((ostream *)local_1a0,":");
        std::ostream::operator<<((ostream *)local_1a0,uVar8);
        pOVar7 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)&locker);
        std::__cxx11::ostringstream::~ostringstream(local_1a0);
      }
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    pNVar1 = (this->HolePuncher)._M_t.
             super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
             ._M_t.
             super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
             .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
    if (pNVar1 != (NATHolePuncher *)0x0) {
      uVar2 = (pNVar1->StartParams).EncryptionKey;
      pPVar3 = (this->Deps).P2PKeyMap;
      local_1d0._M_dataplus._M_p._0_4_ = (undefined4)(uVar2 >> 0x20);
      locker.TheLock = &pPVar3->P2PKeyLock;
      if ((pNVar1->StartParams).WinTies != false) {
        local_1d0._M_dataplus._M_p._0_4_ = (undefined4)uVar2;
      }
      std::recursive_mutex::lock(&(locker.TheLock)->cs);
      bVar6 = ConnectionMap<unsigned_int,_tonk::UInt32Hasher>::Remove
                        (&pPVar3->P2PKeyMap,(uint *)&local_1d0,&this->super_IConnection);
      Locker::~Locker(&locker);
      if (!bVar6 && (int)(this->Logger).ChannelMinLevel < 4) {
        locker.TheLock = (Lock *)(this->Logger).ChannelName;
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::operator<<((ostream *)local_1a0,(string *)&(this->Logger).Prefix);
        std::operator<<((ostream *)local_1a0,"Unable to remove/unassign P2PKey=");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
        pOVar7 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)&locker);
        std::__cxx11::ostringstream::~ostringstream(local_1a0);
      }
    }
  }
  return;
}

Assistant:

void Connection::removeFromMaps()
{
    if (RemovedFromMaps) {
        return;
    }
    RemovedFromMaps = true;

    // Make sure that the maps do not contain the Connection
    bool success = Deps.IdMap->RemoveAndUnassignId(LocallyAssignedIdForRemoteHost, this);
    if (!success) {
        Logger.Warning("Unable to remove/unassign id=", LocallyAssignedIdForRemoteHost);
    }

    const UDPAddress addr = Outgoing.GetPeerUDPAddress();
    success = Deps.AddressMap->RemoveAddress(addr, this);
    if (!success) {
        Logger.Warning("Unable to remove/unassign address ", addr.address().to_string(), ":", addr.port());
    }

    if (HolePuncher) {
        const uint32_t probeKey = HolePuncher->StartParams.GetExpectedIncomingProbeKey();
        success = Deps.P2PKeyMap->RemoveByKey(probeKey, this);
        if (!success) {
            Logger.Warning("Unable to remove/unassign P2PKey=", probeKey);
        }
    }
}